

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

UnitsPtr __thiscall libcellml::Model::units(Model *this,string *name)

{
  const_iterator cVar1;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  UnitsPtr UVar3;
  
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)0x0;
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
       (EntityImpl *)0x0;
  cVar1 = ModelImpl::findUnits((ModelImpl *)name->_M_string_length,in_RDX);
  _Var2._M_pi = extraout_RDX;
  if (cVar1._M_current != *(shared_ptr<libcellml::Units> **)(name->_M_string_length + 0x90)) {
    (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
         (_func_int **)
         ((cVar1._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
                mPimpl,&((cVar1._M_current)->
                        super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount);
    _Var2._M_pi = extraout_RDX_00;
  }
  UVar3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  UVar3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (UnitsPtr)UVar3.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UnitsPtr Model::units(const std::string &name) const
{
    UnitsPtr units = nullptr;
    auto result = pFunc()->findUnits(name);
    if (result != pFunc()->mUnits.end()) {
        units = *result;
    }

    return units;
}